

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O2

void __thiscall MeCab::anon_unknown_0::LatticeImpl::set_result(LatticeImpl *this,char *result)

{
  unsigned_short uVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  size_t max;
  size_t sVar4;
  ostream *poVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  mecab_node_t *pmVar6;
  undefined4 extraout_var_02;
  mecab_node_t *pmVar7;
  undefined4 extraout_var_03;
  mecab_node_t *pmVar8;
  undefined4 extraout_var_04;
  long lVar9;
  long lVar10;
  size_t i;
  ulong uVar11;
  allocator local_e9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  surfaces;
  vector<char_*,_std::allocator<char_*>_> lines;
  char *cols [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  features;
  string sentence;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar2 = (*(this->super_Lattice)._vptr_Lattice[0x16])();
  strlen(result);
  pcVar3 = Allocator<mecab_node_t,_mecab_path_t>::strdup
                     ((Allocator<mecab_node_t,_mecab_path_t> *)CONCAT44(extraout_var,iVar2),result);
  lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  max = strlen(result);
  sVar4 = tokenize<std::back_insert_iterator<std::vector<char*,std::allocator<char*>>>>
                    (pcVar3,"\n",&lines,max);
  if (sVar4 != (long)lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) {
    poVar5 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tagger.cpp"
                            );
    poVar5 = std::operator<<(poVar5,"(");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x324);
    poVar5 = std::operator<<(poVar5,") [");
    poVar5 = std::operator<<(poVar5,"lsize == lines.size()");
    std::operator<<(poVar5,"] ");
    die::~die((die *)&sentence);
  }
  sentence._M_dataplus._M_p = (pointer)&sentence.field_2;
  sentence._M_string_length = 0;
  sentence.field_2._M_local_buf[0] = '\0';
  surfaces.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  surfaces.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  surfaces.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  features.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  features.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  features.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (uVar11 = 0;
      uVar11 < (ulong)((long)lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3); uVar11 = uVar11 + 1) {
    pcVar3 = lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar11];
    iVar2 = strcmp("EOS",pcVar3);
    if (iVar2 == 0) break;
    sVar4 = tokenize<char**>(pcVar3,"\t",cols,2);
    if (sVar4 != 2) break;
    std::__cxx11::string::append((char *)&sentence);
    std::__cxx11::string::string((string *)&local_50,cols[0],&local_e9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&surfaces,
               &local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_50,cols[1],&local_e9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&features,
               &local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if ((long)features.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)features.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
      (long)surfaces.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)surfaces.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
    poVar5 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tagger.cpp"
                            );
    poVar5 = std::operator<<(poVar5,"(");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x335);
    poVar5 = std::operator<<(poVar5,") [");
    poVar5 = std::operator<<(poVar5,"features.size() == surfaces.size()");
    std::operator<<(poVar5,"] ");
    die::~die((die *)&local_50);
  }
  iVar2 = (*(this->super_Lattice)._vptr_Lattice[0x16])(this);
  pcVar3 = Allocator<mecab_node_t,_mecab_path_t>::strdup
                     ((Allocator<mecab_node_t,_mecab_path_t> *)CONCAT44(extraout_var_00,iVar2),
                      sentence._M_dataplus._M_p);
  (*(this->super_Lattice)._vptr_Lattice[9])(this,pcVar3);
  iVar2 = (*(this->super_Lattice)._vptr_Lattice[0x16])(this);
  pmVar6 = Allocator<mecab_node_t,_mecab_path_t>::newNode
                     ((Allocator<mecab_node_t,_mecab_path_t> *)CONCAT44(extraout_var_01,iVar2));
  pmVar6->surface = "BOS/EOS";
  pmVar6->feature = "BOS/EOS";
  pmVar6->stat = '\x02';
  pmVar6->isbest = '\x01';
  iVar2 = (*(this->super_Lattice)._vptr_Lattice[0x16])(this);
  pmVar7 = Allocator<mecab_node_t,_mecab_path_t>::newNode
                     ((Allocator<mecab_node_t,_mecab_path_t> *)CONCAT44(extraout_var_02,iVar2));
  pmVar7->surface = "BOS/EOS";
  pmVar7->feature = "BOS/EOS";
  pmVar7->stat = '\x03';
  pmVar7->isbest = '\x01';
  pmVar6->surface = this->sentence_;
  *(this->end_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl.
   super__Vector_impl_data._M_start = pmVar6;
  lVar10 = 8;
  lVar9 = 0;
  for (uVar11 = 0;
      uVar11 < (ulong)((long)surfaces.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)surfaces.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5); uVar11 = uVar11 + 1) {
    iVar2 = (*(this->super_Lattice)._vptr_Lattice[0x16])(this);
    pmVar8 = Allocator<mecab_node_t,_mecab_path_t>::newNode
                       ((Allocator<mecab_node_t,_mecab_path_t> *)CONCAT44(extraout_var_03,iVar2));
    pmVar8->prev = pmVar6;
    pmVar6->next = pmVar8;
    pmVar8->surface = this->sentence_ + lVar9;
    uVar1 = *(unsigned_short *)
             ((long)&((surfaces.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar10);
    pmVar8->length = uVar1;
    pmVar8->rlength = uVar1;
    pmVar8->stat = '\0';
    pmVar8->isbest = '\x01';
    pmVar8->wcost = 0;
    pmVar8->cost = 0;
    iVar2 = (*(this->super_Lattice)._vptr_Lattice[0x16])(this);
    pcVar3 = Allocator<mecab_node_t,_mecab_path_t>::strdup
                       ((Allocator<mecab_node_t,_mecab_path_t> *)CONCAT44(extraout_var_04,iVar2),
                        *(char **)((long)features.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar10 + -8));
    pmVar8->feature = pcVar3;
    (this->begin_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl
    .super__Vector_impl_data._M_start[lVar9] = pmVar8;
    lVar9 = lVar9 + (ulong)pmVar8->length;
    (this->end_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl.
    super__Vector_impl_data._M_start[lVar9] = pmVar8;
    lVar10 = lVar10 + 0x20;
    pmVar6 = pmVar8;
  }
  pmVar6->next = pmVar7;
  pmVar7->prev = pmVar6;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&features);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&surfaces);
  std::__cxx11::string::~string((string *)&sentence);
  std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
            (&lines.super__Vector_base<char_*,_std::allocator<char_*>_>);
  return;
}

Assistant:

void LatticeImpl::set_result(const char *result) {
  char *str = allocator()->strdup(result, std::strlen(result));
  std::vector<char *> lines;
  const size_t lsize = tokenize(str, "\n",
                                std::back_inserter(lines),
                                std::strlen(result));
  CHECK_DIE(lsize == lines.size());

  std::string sentence;
  std::vector<std::string> surfaces, features;
  for (size_t i = 0; i < lines.size(); ++i) {
    if (::strcmp("EOS", lines[i]) == 0) {
      break;
    }
    char *cols[2];
    if (tokenize(lines[i], "\t", cols, 2) != 2) {
      break;
    }
    sentence += cols[0];
    surfaces.push_back(cols[0]);
    features.push_back(cols[1]);
  }

  CHECK_DIE(features.size() == surfaces.size());

  set_sentence(allocator()->strdup(sentence.c_str(), sentence.size()));

  Node *bos_node = allocator()->newNode();
  bos_node->surface = const_cast<const char *>(BOS_KEY);  // dummy
  bos_node->feature = "BOS/EOS";
  bos_node->isbest = 1;
  bos_node->stat = MECAB_BOS_NODE;

  Node *eos_node = allocator()->newNode();
  eos_node->surface = const_cast<const char *>(BOS_KEY);  // dummy
  eos_node->feature = "BOS/EOS";
  eos_node->isbest = 1;
  eos_node->stat = MECAB_EOS_NODE;

  bos_node->surface = sentence_;
  end_nodes_[0] = bos_node;

  size_t offset = 0;
  Node *prev = bos_node;
  for (size_t i = 0; i < surfaces.size(); ++i) {
    Node *node = allocator()->newNode();
    node->prev = prev;
    prev->next = node;
    node->surface = sentence_ + offset;
    node->length = surfaces[i].size();
    node->rlength = surfaces[i].size();
    node->isbest = 1;
    node->stat = MECAB_NOR_NODE;
    node->wcost = 0;
    node->cost = 0;
    node->feature = allocator()->strdup(features[i].c_str(),
                                        features[i].size());
    begin_nodes_[offset] = node;
    end_nodes_[offset + node->length] = node;
    offset += node->length;
    prev = node;
  }

  prev->next = eos_node;
  eos_node->prev = prev;
}